

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestNestedMessageEnum::_InternalSerialize
          (TestNestedMessageEnum *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestMessageEnum *value;
  string_view s;
  TestNestedMessageEnum *this_00;
  bool bVar1;
  int iVar2;
  RepeatedField<int> *this_01;
  const_reference piVar3;
  uint32_t *puVar4;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_50;
  string *local_40;
  string *_s;
  int local_30;
  int n;
  int i;
  uint32_t cached_has_bits;
  TestNestedMessageEnum *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestNestedMessageEnum *this_local;
  
  n = 0;
  local_30 = 0;
  _i = this;
  this_ = (TestNestedMessageEnum *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  _s._4_4_ = _internal_direct_enum_size(this);
  for (; local_30 < _s._4_4_; local_30 = local_30 + 1) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    this_01 = _internal_direct_enum(_i);
    piVar3 = google::protobuf::RepeatedField<int>::Get(this_01,local_30);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (1,*piVar3,(uint8_t *)stream_local);
  }
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(_i->field_0)._impl_._has_bits_,0);
  n = *puVar4;
  if ((n & 2U) != 0) {
    value = (_i->field_0)._impl_.nested_enum_;
    iVar2 = TestMessageEnum::GetCachedSize((_i->field_0)._impl_.nested_enum_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)value,iVar2,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((n & 1U) != 0) {
    local_40 = _internal_redacted_string_abi_cxx11_(_i);
    data = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"proto2_unittest.TestNestedMessageEnum.redacted_string");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,iVar2,SERIALIZE,local_50);
    this_00 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)this_00,3,s,(uint8_t *)stream_local);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(_i->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_i->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageEnum::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestNestedMessageEnum)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .proto2_unittest.MetaAnnotatedEnum direct_enum = 1;
  for (int i = 0, n = this_._internal_direct_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, static_cast<::proto2_unittest::MetaAnnotatedEnum>(this_._internal_direct_enum().Get(i)),
        target);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestMessageEnum nested_enum = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.nested_enum_, this_._impl_.nested_enum_->GetCachedSize(), target,
        stream);
  }

  // string redacted_string = 3 [debug_redact = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_redacted_string();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestNestedMessageEnum.redacted_string");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestNestedMessageEnum)
  return target;
}